

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O2

void PrintCall(OutputContext *ctx,char *constantData,uint microcodePos)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  int *piVar7;
  int *piVar8;
  
  Print(ctx,"(");
  piVar8 = (int *)(constantData + (ulong)microcodePos * 4);
  while (*piVar8 != 1) {
    switch(*piVar8) {
    case 2:
      uVar5 = (ulong)(uint)piVar8[1];
      pcVar6 = "r%d~";
      break;
    case 3:
      uVar5 = (ulong)(uint)piVar8[1];
      pcVar6 = "r%d";
      break;
    case 4:
      uVar5 = (ulong)(uint)piVar8[1];
      pcVar6 = "%d";
      break;
    case 5:
      uVar5 = (ulong)(uint)piVar8[1];
      pcVar6 = "%dL";
      break;
    case 6:
      iVar4 = piVar8[1];
      piVar7 = piVar8 + 4;
      uVar2 = piVar8[2];
      uVar1 = piVar8[3];
      Print(ctx,"[");
      PrintRegister(ctx,(uchar)iVar4);
      Print(ctx," + 0x%x] x%d",(ulong)uVar2,(ulong)uVar1);
      goto LAB_00249023;
    default:
      __assert_fail("!\"unknown micro instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                    ,0xaf,"void PrintCall(OutputContext &, char *, unsigned int)");
    }
    piVar7 = piVar8 + 2;
    Print(ctx,pcVar6,uVar5);
LAB_00249023:
    piVar8 = piVar7;
    if (*piVar7 != 1) {
      Print(ctx,", ");
    }
  }
  Print(ctx,") -> ");
  uVar2 = piVar8[2];
  if (5 < uVar2) {
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                  ,0xd2,"void PrintCall(OutputContext &, char *, unsigned int)");
  }
  piVar7 = piVar8 + 3;
  switch(uVar2) {
  case 0:
    pcVar6 = "void";
    break;
  case 1:
    pcVar6 = "double (r%d";
    goto LAB_0024909d;
  case 2:
    pcVar6 = "long (r%d";
    goto LAB_0024909d;
  case 3:
    pcVar6 = "int (r%d";
LAB_0024909d:
    Print(ctx,pcVar6,(ulong)(uint)piVar8[1]);
    goto LAB_002490fa;
  case 4:
    pcVar6 = "struct (";
    break;
  case 5:
    pcVar6 = "error";
  }
  do {
    Print(ctx,pcVar6);
LAB_002490fa:
    do {
      iVar4 = *piVar7;
      if (iVar4 == 7) {
        pcVar6 = ") @%d";
        if (uVar2 == 0) {
          pcVar6 = " @%d";
        }
        if (uVar2 == 5) {
          pcVar6 = " @%d";
        }
        Print(ctx,pcVar6,(ulong)(microcodePos << 2));
        return;
      }
      if (iVar4 == 10) {
        iVar4 = piVar7[1];
        piVar8 = piVar7 + 4;
        uVar1 = piVar7[2];
        uVar3 = piVar7[3];
        Print(ctx,"[");
        PrintRegister(ctx,(uchar)iVar4);
        Print(ctx," + 0x%x] x%d",(ulong)uVar1,(ulong)uVar3);
      }
      else {
        if (iVar4 == 9) {
          uVar1 = piVar7[1];
          pcVar6 = "r%d";
        }
        else {
          if (iVar4 != 8) {
            __assert_fail("!\"unknown micro instruction\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                          ,0xeb,"void PrintCall(OutputContext &, char *, unsigned int)");
          }
          uVar1 = piVar7[1];
          pcVar6 = "r%d~";
        }
        piVar8 = piVar7 + 2;
        Print(ctx,pcVar6,(ulong)uVar1);
      }
      piVar7 = piVar8;
    } while (*piVar8 == 7);
    pcVar6 = ", ";
  } while( true );
}

Assistant:

void PrintCall(OutputContext &ctx, char *constantData, unsigned microcodePos)
{
	Print(ctx, "(");

	unsigned *microcode = (unsigned*)constantData + microcodePos;

	while(*microcode != rvmiCall)
	{
		switch(*microcode++)
		{
		case rvmiPush:
			Print(ctx, "r%d~", *microcode++);
			break;
		case rvmiPushQword:
			Print(ctx, "r%d", *microcode++);
			break;
		case rvmiPushImm:
			Print(ctx, "%d", *microcode++);
			break;
		case rvmiPushImmq:
			Print(ctx, "%dL", *microcode++);
			break;
		case rvmiPushMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			Print(ctx, "[");
			PrintRegister(ctx, (unsigned char)reg);
			Print(ctx, " + 0x%x] x%d", offset, size);
		}
		break;
		default:
			assert(!"unknown micro instruction");
		}

		if(*microcode != rvmiCall)
			Print(ctx, ", ");
	}

	Print(ctx, ") -> ");

	microcode++;

	unsigned targetReg = *microcode++;
	unsigned resultType = *microcode++;

	switch(resultType)
	{
	case rvrVoid:
		Print(ctx, "void");
		break;
	case rvrDouble:
		Print(ctx, "double (r%d", targetReg);
		break;
	case rvrLong:
		Print(ctx, "long (r%d", targetReg);
		break;
	case rvrInt:
		Print(ctx, "int (r%d", targetReg);
		break;
	case rvrStruct:
		Print(ctx, "struct (");
		break;
	case rvrError:
		Print(ctx, "error");
		break;
	default:
		assert(!"unknown type");
	}

	while(*microcode != rvmiReturn)
	{
		switch(*microcode++)
		{
		case rvmiPop:
			Print(ctx, "r%d~", *microcode++);
			break;
		case rvmiPopq:
			Print(ctx, "r%d", *microcode++);
			break;
		case rvmiPopMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			Print(ctx, "[");
			PrintRegister(ctx, (unsigned char)reg);
			Print(ctx, " + 0x%x] x%d", offset, size);
		}
		break;
		default:
			assert(!"unknown micro instruction");
		}

		if(*microcode != rvmiReturn)
			Print(ctx, ", ");
	}

	if(resultType == rvrVoid || resultType == rvrError)
		Print(ctx, " @%d", microcodePos * 4);
	else
		Print(ctx, ") @%d", microcodePos * 4);
}